

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O2

void __thiscall
MlNeuron::MlNeuron(MlNeuron *this,Time *time,double v_0,double theta,double spikeheight,double tau,
                  double v_rest,string *name,string *type)

{
  StochasticEventGenerator *this_00;
  DifferentialEquation *this_01;
  VoltageDependance *this_02;
  StochasticVariable *pSVar1;
  MlCalciumChannel *this_03;
  MlPotassiumChannel *this_04;
  allocator<char> local_2cc;
  allocator<char> local_2cb;
  allocator<char> local_2ca;
  allocator<char> local_2c9;
  DifferentialEquation *local_2c8;
  string local_2c0;
  string local_2a0;
  Unit local_280;
  Unit local_218;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  Unit local_98;
  
  local_2c8 = (DifferentialEquation *)v_0;
  local_1b0 = tau;
  local_1a8 = v_rest;
  local_1a0 = theta;
  std::__cxx11::string::string((string *)&local_b8,(string *)name);
  std::__cxx11::string::string((string *)&local_d8,(string *)type);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron = (_func_int **)&PTR_addStimulus_00155b48;
  this_00 = &(this->super_SpikingNeuron).super_StochasticEventGenerator;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric = (_func_int **)&PTR__MlNeuron_00155b90;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlNeuron_00155c28;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__MlNeuron_00155c70;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"V",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Differential Equation",(allocator<char> *)&local_2a0);
  this_01 = &this->mlneuronMembrane;
  DifferentialEquation::DifferentialEquation
            (this_01,time,(double)local_2c8,0.0,(string *)&local_280,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Differential Equation",(allocator<char> *)&local_2a0);
  local_2c8 = &this->mlneuronRelaxation;
  DifferentialEquation::DifferentialEquation(local_2c8,(string *)&local_280,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"threshold",(allocator<char> *)&local_218);
  Parametric::addParameter((Parametric *)this_00,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"spike-height",(allocator<char> *)&local_218);
  Parametric::addParameter((Parametric *)this_00,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"membrane",(allocator<char> *)&local_218);
  Parametric::addParameter((Parametric *)this_00,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::assign
            ((char *)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                      super_StochasticVariable.super_StochasticProcess.super_Physical.
                      physicalDescription);
  std::__cxx11::string::assign
            ((char *)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                      super_StochasticVariable.super_StochasticProcess.stochDescription);
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventCurrentValue = false;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
  this->mlneuronTheta = local_1a0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"m",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"V",(allocator<char> *)&local_2a0);
  Unit::Unit(&local_280,&local_f8,&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"u",&local_2cb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"F",&local_2cc);
  Unit::Unit(&local_218,&local_138,&local_158);
  operator*(&local_98,&local_280,&local_218);
  Physical::setUnit(&(this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                     super_Physical,&local_98);
  Unit::~Unit(&local_98);
  Unit::~Unit(&local_218);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  Unit::~Unit(&local_280);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"m",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"V",(allocator<char> *)&local_2c0);
  Unit::Unit(&local_280,&local_178,&local_198);
  Unit::operator=(&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                   super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit,
                  &local_280);
  Unit::~Unit(&local_280);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  this_02 = (VoltageDependance *)operator_new(0x160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"leak",&local_2cb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Weighted Difference",&local_2cc);
  VoltageDependance::VoltageDependance
            (this_02,1.0 / local_1b0,local_1a8,(string *)&local_280,(string *)&local_218);
  pSVar1 = (StochasticVariable *)operator_new(0x148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"t",&local_2c9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Time Process",&local_2ca)
  ;
  TimeProcess::TimeProcess((TimeProcess *)pSVar1,time,&local_2c0,&local_2a0);
  DifferentialEquation::addTerm(this_01,(StochasticFunction *)this_02,pSVar1);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_280);
  this_03 = (MlCalciumChannel *)operator_new(0x168);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",&local_2cb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Calcium Channel",&local_2cc);
  MlCalciumChannel::MlCalciumChannel(this_03,0.0,0.0,(string *)&local_280,(string *)&local_218);
  pSVar1 = (StochasticVariable *)operator_new(0x148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"t",&local_2c9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Time Process",&local_2ca)
  ;
  TimeProcess::TimeProcess((TimeProcess *)pSVar1,time,&local_2c0,&local_2a0);
  DifferentialEquation::addTerm(this_01,(StochasticFunction *)this_03,pSVar1);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_280);
  this_04 = (MlPotassiumChannel *)operator_new(0x308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",&local_2cb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Potassium Channel",&local_2cc);
  MlPotassiumChannel::MlPotassiumChannel(this_04,0.0,0.0,(string *)&local_280,(string *)&local_218);
  pSVar1 = (StochasticVariable *)operator_new(0x148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"t",&local_2c9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Time Process",&local_2ca)
  ;
  TimeProcess::TimeProcess((TimeProcess *)pSVar1,time,&local_2c0,&local_2a0);
  DifferentialEquation::addTerm(this_01,(StochasticFunction *)this_04,pSVar1);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_280);
  return;
}

Assistant:

MlNeuron::MlNeuron(Time *time, double v_0, double theta, double spikeheight, double tau, double v_rest, const string& name, const string& type)
	: SpikingNeuron(time, name, type), mlneuronMembrane(time, v_0, 0.0, "V")
{
	// parameter accessors
	addParameter("threshold");
	addParameter("spike-height");
	addParameter("membrane");
	
	// write descriptions
	physicalDescription = "voltage";
	stochDescription = "LIF Neuron membrane";
	
	// assign values
	eventCurrentValue = false;
	eventNextValue = false;
	mlneuronTheta = theta;	
	mlneuronMembrane.setUnit( Unit("m","V") * Unit("u","F") );
	physicalUnit = Unit("m","V");
	
	// add decay terms
	mlneuronMembrane.addTerm( new VoltageDependance(1.0/tau, v_rest, "leak"), new TimeProcess(time) );
	mlneuronMembrane.addTerm( new MlCalciumChannel(0.0, 0.0, ""), new TimeProcess(time) );
	mlneuronMembrane.addTerm( new MlPotassiumChannel(0.0, 0.0, ""), new TimeProcess(time) );
}